

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SplitNDLayerParams::MergeFrom
          (SplitNDLayerParams *this,SplitNDLayerParams *from)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xcfe8);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(&this->splitsizes_,&from->splitsizes_);
  if (from->axis_ != 0) {
    this->axis_ = from->axis_;
  }
  if (from->numsplits_ != 0) {
    this->numsplits_ = from->numsplits_;
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void SplitNDLayerParams::MergeFrom(const SplitNDLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SplitNDLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  splitsizes_.MergeFrom(from.splitsizes_);
  if (from._internal_axis() != 0) {
    _internal_set_axis(from._internal_axis());
  }
  if (from._internal_numsplits() != 0) {
    _internal_set_numsplits(from._internal_numsplits());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}